

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

size_t __thiscall
iDynTree::SubModelDecomposition::getSubModelOfLink(SubModelDecomposition *this,LinkIndex *link)

{
  size_type sVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  size_type *in_RSI;
  long in_RDI;
  size_t ret;
  
  if ((-1 < (long)*in_RSI) &&
     (sVar1 = *in_RSI,
     sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18)),
     (long)sVar1 < (long)sVar2)) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x18),
                        *in_RSI);
    return *pvVar3;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,
                           "SubModelDecomposition error: requested link index ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RSI);
  poVar4 = std::operator<<(poVar4,"outside bounds ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

size_t SubModelDecomposition::getSubModelOfLink(const LinkIndex& link) const
{
    size_t ret = 0;

    if( link >= 0 &&  link < (LinkIndex) this->link2subModelIndex.size() )
    {
        ret = link2subModelIndex[link];
    }
    else
    {
        std::cerr << "SubModelDecomposition error: requested link index " << link
                  << "outside bounds " << std::endl;
    }

    return ret;
}